

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_exception.hxx
# Opt level: O3

void __thiscall nuraft::rpc_exception::~rpc_exception(rpc_exception *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  *(undefined ***)this = &PTR__rpc_exception_0017fe78;
  pcVar1 = (this->err_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->err_).field_2) {
    operator_delete(pcVar1);
  }
  this_00 = (this->req_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::exception::~exception(&this->super_exception);
  operator_delete(this);
  return;
}

Assistant:

rpc_exception(const std::string& err, ptr<req_msg> req)
        : req_(req), err_(err.c_str()) {}